

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

Id __thiscall
dxil_spv::Converter::Impl::get_physical_pointer_block_type
          (Impl *this,Id base_type_id,PhysicalPointerMeta *meta)

{
  uint32_t uVar1;
  bool bVar2;
  int __val;
  int iVar3;
  Id IVar4;
  Id sizeId;
  Builder *pBVar5;
  Builder *pBVar6;
  Op OVar7;
  __normal_iterator<dxil_spv::Converter::Impl::PhysicalPointerEntry_*,_std::vector<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>_>
  __it;
  long lVar8;
  char *pcVar9;
  __normal_iterator<dxil_spv::Converter::Impl::PhysicalPointerEntry_*,_std::vector<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>_>
  _Var10;
  long lVar11;
  Id base_type_id_local;
  PhysicalPointerEntry *local_98;
  Id local_8c;
  String type;
  string local_58;
  
  type._M_string_length = (size_type)&base_type_id_local;
  __it._M_current =
       (this->physical_pointer_entries).
       super__Vector_base<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_98 = (this->physical_pointer_entries).
             super__Vector_base<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)local_98 - (long)__it._M_current;
  lVar11 = lVar8 / 0x14 >> 2;
  base_type_id_local = base_type_id;
  type._M_dataplus._M_p = &meta->nonwritable;
  for (; _Var10._M_current = __it._M_current, 0 < lVar11; lVar11 = lVar11 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::$_0>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:768:92)>
                          *)&type,__it);
    if (bVar2) goto LAB_0010ef04;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::$_0>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:768:92)>
                          *)&type,__it._M_current + 1);
    _Var10._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_0010ef04;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::$_0>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:768:92)>
                          *)&type,__it._M_current + 2);
    _Var10._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_0010ef04;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::$_0>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:768:92)>
                          *)&type,__it._M_current + 3);
    _Var10._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_0010ef04;
    __it._M_current = __it._M_current + 4;
    lVar8 = lVar8 + -0x50;
  }
  lVar8 = lVar8 / 0x14;
  if (lVar8 == 1) {
LAB_0010eff5:
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::$_0>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:768:92)>
                          *)&type,__it);
    _Var10._M_current = __it._M_current;
    if (!bVar2) {
      _Var10._M_current = local_98;
    }
LAB_0010ef04:
    if (_Var10._M_current != local_98) {
      return (_Var10._M_current)->ptr_type_id;
    }
  }
  else {
    if (lVar8 == 2) {
LAB_0010eedf:
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::$_0>
              ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:768:92)>
                            *)&type,__it);
      _Var10._M_current = __it._M_current;
      if (!bVar2) {
        __it._M_current = __it._M_current + 1;
        goto LAB_0010eff5;
      }
      goto LAB_0010ef04;
    }
    if (lVar8 == 3) {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::$_0>
              ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:768:92)>
                            *)&type,__it);
      if (!bVar2) {
        __it._M_current = __it._M_current + 1;
        goto LAB_0010eedf;
      }
      goto LAB_0010ef04;
    }
  }
  pBVar5 = builder(this);
  __val = spv::Builder::getNumTypeConstituents(pBVar5,base_type_id_local);
  pBVar5 = builder(this);
  iVar3 = spv::Builder::getScalarTypeWidth(pBVar5,base_type_id_local);
  pBVar5 = builder(this);
  OVar7 = (pBVar5->module).idToInstruction.
          super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_start[base_type_id_local]->opCode;
  if (OVar7 == OpTypeVector) {
    pBVar5 = builder(this);
    pBVar6 = builder(this);
    IVar4 = spv::Builder::getScalarTypeId(pBVar6,base_type_id_local);
    OVar7 = (pBVar5->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start[IVar4]->opCode;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  basic_string(&type,"PhysicalPointer",(ThreadLocalAllocator<char> *)&local_58);
  if (OVar7 == OpTypeInt) {
    if (iVar3 == 0x10) {
      pcVar9 = "Ushort";
    }
    else if (iVar3 == 0x40) {
      pcVar9 = "Uint64";
    }
    else {
      if (iVar3 != 0x20) goto LAB_0010f041;
      pcVar9 = "Uint";
    }
  }
  else {
    if (OVar7 != OpTypeFloat) goto LAB_0010f041;
    if (iVar3 == 0x10) {
      pcVar9 = "Half";
    }
    else if (iVar3 == 0x40) {
      pcVar9 = "Double";
    }
    else {
      if (iVar3 != 0x20) goto LAB_0010f041;
      pcVar9 = "Float";
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  append(&type,pcVar9);
LAB_0010f041:
  if (1 < __val) {
    std::__cxx11::to_string(&local_58,__val);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::append(&type,local_58._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
  }
  if (meta->nonwritable == true) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::append(&type,"NonWrite");
  }
  if (meta->nonreadable == true) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::append(&type,"NonRead");
  }
  if (meta->coherent == true) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::append(&type,"Coherent");
  }
  IVar4 = base_type_id_local;
  if (meta->stride != '\0') {
    uVar1 = meta->size;
    pBVar5 = builder(this);
    if (uVar1 == 0) {
      IVar4 = spv::Builder::makeRuntimeArray(pBVar5,IVar4);
      pcVar9 = "Array";
    }
    else {
      pBVar6 = builder(this);
      sizeId = spv::Builder::makeUintConstant(pBVar6,meta->size / (uint)meta->stride,false);
      IVar4 = spv::Builder::makeArrayType(pBVar5,IVar4,sizeId,(uint)meta->stride);
      pcVar9 = "CBVArray";
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::append(&type,pcVar9);
    pBVar5 = builder(this);
    spv::Builder::addDecoration(pBVar5,IVar4,DecorationArrayStride,(uint)meta->stride);
  }
  pBVar5 = builder(this);
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  local_8c = IVar4;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_58,
             &local_8c);
  IVar4 = spv::Builder::makeStructType(pBVar5,(Vector<Id> *)&local_58,type._M_dataplus._M_p);
  std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)&local_58)
  ;
  pBVar5 = builder(this);
  spv::Builder::addMemberDecoration(pBVar5,IVar4,0,DecorationOffset,0);
  pBVar5 = builder(this);
  spv::Builder::addMemberName(pBVar5,IVar4,0,"value");
  pBVar5 = builder(this);
  spv::Builder::addDecoration(pBVar5,IVar4,DecorationBlock,-1);
  if (meta->nonwritable == true) {
    pBVar5 = builder(this);
    spv::Builder::addMemberDecoration(pBVar5,IVar4,0,DecorationNonWritable,-1);
  }
  if (meta->nonreadable == true) {
    pBVar5 = builder(this);
    spv::Builder::addMemberDecoration(pBVar5,IVar4,0,DecorationNonReadable,-1);
  }
  if (meta->coherent == true) {
    pBVar5 = builder(this);
    spv::Builder::addMemberDecoration(pBVar5,IVar4,0,DecorationCoherent,-1);
  }
  pBVar5 = builder(this);
  IVar4 = spv::Builder::makePointer(pBVar5,StorageClassPhysicalStorageBuffer,IVar4);
  local_58._M_dataplus._M_p._4_4_ = base_type_id_local;
  local_58._M_dataplus._M_p._0_4_ = IVar4;
  local_58._M_string_length._0_1_ = meta->nonwritable;
  local_58._M_string_length._1_1_ = meta->nonreadable;
  local_58._M_string_length._2_1_ = meta->coherent;
  local_58._M_string_length._3_1_ = meta->rov;
  local_58._M_string_length._4_1_ = meta->stride;
  local_58._M_string_length._5_3_ = *(undefined3 *)&meta->field_0x5;
  local_58.field_2._M_allocated_capacity._0_4_ = meta->size;
  std::
  vector<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>
  ::push_back(&this->physical_pointer_entries,(value_type *)&local_58);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  _M_dispose(&type);
  return IVar4;
}

Assistant:

spv::Id Converter::Impl::get_physical_pointer_block_type(spv::Id base_type_id, const PhysicalPointerMeta &meta)
{
	auto itr = std::find_if(physical_pointer_entries.begin(), physical_pointer_entries.end(), [&](const PhysicalPointerEntry &entry) {
		return entry.meta.coherent == meta.coherent &&
		       entry.meta.nonreadable == meta.nonreadable &&
		       entry.meta.nonwritable == meta.nonwritable &&
		       entry.meta.size == meta.size &&
		       entry.meta.stride == meta.stride &&
		       entry.base_type_id == base_type_id;
	});

	if (itr != physical_pointer_entries.end())
		return itr->ptr_type_id;

	int vecsize = builder().getNumTypeComponents(base_type_id);
	int width = builder().getScalarTypeWidth(base_type_id);

	spv::Op op = builder().getTypeClass(base_type_id);
	if (op == spv::OpTypeVector)
		op = builder().getTypeClass(builder().getScalarTypeId(base_type_id));

	String type = "PhysicalPointer";
	switch (op)
	{
	case spv::OpTypeFloat:
		if (width == 16)
			type += "Half";
		else if (width == 32)
			type += "Float";
		else if (width == 64)
			type += "Double";
		break;

	case spv::OpTypeInt:
		if (width == 16)
			type += "Ushort";
		else if (width == 32)
			type += "Uint";
		else if (width == 64)
			type += "Uint64";
		break;

	default:
		break;
	}

	if (vecsize > 1)
		type += std::to_string(vecsize).c_str();

	if (meta.nonwritable)
		type += "NonWrite";
	if (meta.nonreadable)
		type += "NonRead";
	if (meta.coherent)
		type += "Coherent";

	spv::Id type_id = base_type_id;

	if (meta.stride > 0)
	{
		if (meta.size == 0)
		{
			type_id = builder().makeRuntimeArray(type_id);
			type += "Array";
		}
		else
		{
			type_id = builder().makeArrayType(type_id, builder().makeUintConstant(meta.size / meta.stride),
			                                  meta.stride);
			type += "CBVArray";
		}
		builder().addDecoration(type_id, spv::DecorationArrayStride, meta.stride);
	}

	spv::Id block_type_id = builder().makeStructType({ type_id }, type.c_str());
	builder().addMemberDecoration(block_type_id, 0, spv::DecorationOffset, 0);
	builder().addMemberName(block_type_id, 0, "value");
	builder().addDecoration(block_type_id, spv::DecorationBlock);

	if (meta.nonwritable)
		builder().addMemberDecoration(block_type_id, 0, spv::DecorationNonWritable);
	if (meta.nonreadable)
		builder().addMemberDecoration(block_type_id, 0, spv::DecorationNonReadable);
	if (meta.coherent)
		builder().addMemberDecoration(block_type_id, 0, spv::DecorationCoherent);

	spv::Id ptr_type_id = builder().makePointer(spv::StorageClassPhysicalStorageBuffer, block_type_id);
	PhysicalPointerEntry new_entry = {};
	new_entry.ptr_type_id = ptr_type_id;
	new_entry.base_type_id = base_type_id;
	new_entry.meta = meta;
	physical_pointer_entries.push_back(new_entry);
	return ptr_type_id;
}